

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyb_gga_xc_edf2.c
# Opt level: O2

void hyb_gga_xc_edf2_init(xc_func_type *p)

{
  xc_mix_init(p,6,hyb_gga_xc_edf2_init::funcs_id,hyb_gga_xc_edf2_init::funcs_coef);
  xc_func_set_ext_params(p->func_aux[2],hyb_gga_xc_edf2_init::par_x_b88);
  xc_func_set_ext_params(p->func_aux[5],hyb_gga_xc_edf2_init::par_c_lyp);
  xc_hyb_init_hybrid(p,0.1695);
  return;
}

Assistant:

static void
hyb_gga_xc_edf2_init(xc_func_type *p)
{
  static int    funcs_id  [6] = {XC_LDA_X, XC_GGA_X_B88, XC_GGA_X_B88, XC_LDA_C_VWN, XC_GGA_C_LYP, XC_GGA_C_LYP};
  static double funcs_coef[6] = {0.2811, 0.6227, -0.0551, 0.3029, 0.5998, -0.0053};

  static double par_x_b88[] = {0.0035, 6.0};
  static double par_c_lyp[] = {0.055, 0.158, 0.25, 0.3505};

  xc_mix_init(p, 6, funcs_id, funcs_coef);
  xc_func_set_ext_params(p->func_aux[2], par_x_b88);
  xc_func_set_ext_params(p->func_aux[5], par_c_lyp);

  xc_hyb_init_hybrid(p, 0.1695);
}